

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondEpsGen.h
# Opt level: O0

bool __thiscall
covenant::CondEpsGen<covenant::Sym>::addEpsTrans(CondEpsGen<covenant::Sym> *this,int qi,int qj)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *this_00;
  CondEpsGen<covenant::Sym> *pCVar4;
  int in_EDX;
  int in_ESI;
  CondEpsGen<covenant::Sym> *in_RDI;
  prod_info pVar5;
  int qk;
  uint pi_1;
  vector<int,_std::allocator<int>_> *fwd;
  int p_1;
  int qh;
  uint pi;
  vector<int,_std::allocator<int>_> *rev;
  CondEpsGen<covenant::Sym> *in_stack_00000050;
  int p;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  CondEpsGen<covenant::Sym> *in_stack_ffffffffffffff80;
  value_type_conflict *in_stack_ffffffffffffff88;
  vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  *this_01;
  uint local_5c;
  int local_4c;
  uint local_44;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int qi_00;
  
  if (in_ESI < in_EDX) {
    this_01 = &in_RDI->decisions;
    pVar5 = mk_prod(in_RDI,in_ESI,-1,in_EDX);
    std::
    vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
    ::push_back((vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
                 *)in_stack_ffffffffffffff80,
                (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&in_RDI->eps_preds,(long)in_EDX);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_01,in_stack_ffffffffffffff88);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&in_RDI->eps_succs,(long)in_ESI);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_01,in_stack_ffffffffffffff88);
    for (qi_00 = 0; qi_00 < in_RDI->nprods; qi_00 = qi_00 + 1) {
      in_stack_ffffffffffffffc0 =
           prod_rev(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      local_44 = 0;
      while( true ) {
        uVar2 = (ulong)local_44;
        sVar3 = std::vector<int,_std::allocator<int>_>::size(in_stack_ffffffffffffffc0);
        if (sVar3 <= uVar2) break;
        std::vector<int,_std::allocator<int>_>::operator[]
                  (in_stack_ffffffffffffffc0,(ulong)local_44);
        addProd(pVar5._0_8_,qi_00,in_stack_ffffffffffffffc8,
                (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
        local_44 = local_44 + 1;
      }
    }
    for (local_4c = 0; local_4c < in_RDI->nprods; local_4c = local_4c + 1) {
      this_00 = prod_fwd(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                         in_stack_ffffffffffffff78);
      local_5c = 0;
      while( true ) {
        in_stack_ffffffffffffff80 = (CondEpsGen<covenant::Sym> *)(ulong)local_5c;
        pCVar4 = (CondEpsGen<covenant::Sym> *)std::vector<int,_std::allocator<int>_>::size(this_00);
        if (pCVar4 <= in_stack_ffffffffffffff80) break;
        std::vector<int,_std::allocator<int>_>::operator[](this_00,(ulong)local_5c);
        addProd(pVar5._0_8_,qi_00,in_stack_ffffffffffffffc8,
                (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
        local_5c = local_5c + 1;
      }
    }
    bVar1 = update_prods(in_stack_00000050);
    return bVar1;
  }
  __assert_fail("qi < qj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/refinement/CondEpsGen.h"
                ,0xcd,
                "bool covenant::CondEpsGen<covenant::Sym>::addEpsTrans(int, int) [EdgeSym = covenant::Sym]"
               );
}

Assistant:

bool addEpsTrans(int qi, int qj)
    {
      assert(qi < qj);
      
      // FIXME: Check that the epsilon transition doesn't
      // already (transitively) exist.

      // Record the decision
      decisions.push_back(mk_prod(qi, EPSSYM, qj));

      // Add it to the set of transitions
      eps_preds[qj].push_back(qi);
      eps_succs[qi].push_back(qj);
      
      // Extend any {qh, A, qi} to {qh, A, qj}
      for(int p = 0; p < nprods; p++)
      {
        vector<int>& rev(prod_rev(qi, p));
        for(unsigned int pi = 0; pi < rev.size(); pi++)
        {
          int qh = rev[pi];
          addProd(qh, p, qj);
        }
      }
      
      // Now extend any {qj, A, qk} to {qi, A, qk}
      for(int p = 0; p < nprods; p++)
      {
        vector<int>& fwd(prod_fwd(qj, p));
        for(unsigned int pi = 0; pi < fwd.size(); pi++)
        {
          int qk = fwd[pi];
          addProd(qi, p, qk); 
        }
      }
      
      return update_prods();
    }